

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Subprocess.cpp
# Opt level: O2

void __thiscall llbuild::basic::ProcessGroup::~ProcessGroup(ProcessGroup *this)

{
  unique_lock<std::mutex> lock;
  unique_lock<std::mutex> uStack_28;
  
  std::unique_lock<std::mutex>::unique_lock(&uStack_28,&this->mutex);
  while ((this->processes)._M_h._M_element_count != 0) {
    std::condition_variable::wait((unique_lock *)&this->processesCondition);
  }
  std::unique_lock<std::mutex>::~unique_lock(&uStack_28);
  std::condition_variable::~condition_variable(&this->processesCondition);
  std::
  _Hashtable<int,_std::pair<const_int,_llbuild::basic::ProcessInfo>,_std::allocator<std::pair<const_int,_llbuild::basic::ProcessInfo>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable((_Hashtable<int,_std::pair<const_int,_llbuild::basic::ProcessInfo>,_std::allocator<std::pair<const_int,_llbuild::basic::ProcessInfo>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)this);
  return;
}

Assistant:

ProcessGroup::~ProcessGroup() {
  // Wait for all processes in the process group to terminate
  std::unique_lock<std::mutex> lock(mutex);
  while (!processes.empty()) {
    processesCondition.wait(lock);
  }
}